

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format_decode_data_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::objectivec::anon_unknown_0::
ObjCHelperDeathTest_TextFormatDecodeData_Failures_Test::TestBody
          (ObjCHelperDeathTest_TextFormatDecodeData_Failures_Test *this)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  char *regex;
  char *regex_00;
  char *regex_01;
  char *regex_02;
  char *regex_03;
  char *regex_04;
  string_view desired_output;
  AssertHelper local_3f8;
  Message local_3f0 [6];
  exception *gtest_exception_5;
  string_view local_3b0;
  ReturnSentinel local_3a0;
  ReturnSentinel gtest_sentinel_5;
  unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
  gtest_dt_ptr_5;
  pointer local_378;
  DeathTest *gtest_dt_5;
  string_view local_360;
  string_view local_350;
  string_view local_340;
  string_view local_330;
  string_view local_320;
  AssertHelper local_310;
  Message local_308 [6];
  exception *gtest_exception_4;
  char *local_2d0;
  string_view local_2c8;
  ReturnSentinel local_2b8;
  ReturnSentinel gtest_sentinel_4;
  unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
  gtest_dt_ptr_4;
  pointer local_290;
  DeathTest *gtest_dt_4;
  Message local_280 [6];
  exception *gtest_exception_3;
  string_view local_240;
  ReturnSentinel local_230;
  ReturnSentinel gtest_sentinel_3;
  unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
  gtest_dt_ptr_3;
  pointer local_208;
  DeathTest *gtest_dt_3;
  string local_1f8 [8];
  string str_with_null_char;
  Message local_1d0 [6];
  exception *gtest_exception_2;
  string_view local_190;
  ReturnSentinel local_180;
  ReturnSentinel gtest_sentinel_2;
  unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
  gtest_dt_ptr_2;
  pointer local_158;
  DeathTest *gtest_dt_2;
  Message local_148 [6];
  exception *gtest_exception_1;
  string_view local_108;
  ReturnSentinel local_f8;
  ReturnSentinel gtest_sentinel_1;
  unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
  gtest_dt_ptr_1;
  pointer local_d0;
  DeathTest *gtest_dt_1;
  Message local_c0;
  int local_b4;
  exception *gtest_exception;
  string_view local_78;
  ReturnSentinel local_68;
  ReturnSentinel gtest_sentinel;
  unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
  gtest_dt_ptr;
  pointer local_40;
  DeathTest *gtest_dt;
  undefined1 local_28 [8];
  TextFormatDecodeData decode_data;
  ObjCHelperDeathTest_TextFormatDecodeData_Failures_Test *this_local;
  
  decode_data.entries_.
  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  TextFormatDecodeData::TextFormatDecodeData((TextFormatDecodeData *)local_28);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr,
               (internal *)"error: got empty string for making TextFormat data, input:",regex);
    bVar1 = testing::internal::DeathTest::Create
                      ("decode_data.AddString(1, \"\", \"\")",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&gtest_dt_ptr,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/objectivec/text_format_decode_data_unittest.cc"
                       ,200,&local_40);
    testing::
    Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~Matcher((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr);
    if (((bVar1 ^ 0xffU) & 1) != 0) goto LAB_00f84147;
    if (local_40 != (pointer)0x0) {
      std::
      unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>::
      unique_ptr<std::default_delete<testing::internal::DeathTest>,void>
                ((unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>
                  *)&gtest_sentinel,local_40);
      iVar2 = (*local_40->_vptr_DeathTest[2])();
      if (iVar2 == 0) {
        iVar2 = (*local_40->_vptr_DeathTest[3])();
        bVar1 = testing::internal::ExitedUnsuccessfully(iVar2);
        uVar3 = (*local_40->_vptr_DeathTest[4])(local_40,(ulong)bVar1);
        if ((uVar3 & 1) != 0) goto LAB_00f8410f;
        local_b4 = 2;
      }
      else {
        if (iVar2 == 1) {
          testing::internal::DeathTest::ReturnSentinel::ReturnSentinel(&local_68,local_40);
          bVar1 = testing::internal::AlwaysTrue();
          if (bVar1) {
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (&local_78,anon_var_dwarf_37cdd0 + 5);
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      ((basic_string_view<char,_std::char_traits<char>_> *)&gtest_exception,
                       anon_var_dwarf_37cdd0 + 5);
            TextFormatDecodeData::AddString
                      ((TextFormatDecodeData *)local_28,1,local_78,_gtest_exception);
          }
          (*local_40->_vptr_DeathTest[5])(local_40,2);
          testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&local_68);
        }
LAB_00f8410f:
        local_b4 = 0;
      }
      std::
      unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>::
      ~unique_ptr((unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
                   *)&gtest_sentinel);
      if (local_b4 != 0) goto LAB_00f84147;
    }
  }
  else {
LAB_00f84147:
    testing::Message::Message(&local_c0);
    pcVar4 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/objectivec/text_format_decode_data_unittest.cc"
               ,200,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt_1,&local_c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt_1);
    testing::Message::~Message(&local_c0);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr_1,
               (internal *)"error: got empty string for making TextFormat data, input:",regex_00);
    bVar1 = testing::internal::DeathTest::Create
                      ("decode_data.AddString(1, \"a\", \"\")",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&gtest_dt_ptr_1,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/objectivec/text_format_decode_data_unittest.cc"
                       ,0xca,&local_d0);
    testing::
    Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~Matcher((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr_1);
    if (((bVar1 ^ 0xffU) & 1) != 0) goto LAB_00f845bb;
    if (local_d0 != (pointer)0x0) {
      std::
      unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>::
      unique_ptr<std::default_delete<testing::internal::DeathTest>,void>
                ((unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>
                  *)&gtest_sentinel_1,local_d0);
      iVar2 = (*local_d0->_vptr_DeathTest[2])();
      if (iVar2 == 0) {
        iVar2 = (*local_d0->_vptr_DeathTest[3])();
        bVar1 = testing::internal::ExitedUnsuccessfully(iVar2);
        uVar3 = (*local_d0->_vptr_DeathTest[4])(local_d0,(ulong)bVar1);
        if ((uVar3 & 1) != 0) goto LAB_00f8457d;
        local_b4 = 4;
      }
      else {
        if (iVar2 == 1) {
          testing::internal::DeathTest::ReturnSentinel::ReturnSentinel(&local_f8,local_d0);
          bVar1 = testing::internal::AlwaysTrue();
          if (bVar1) {
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_108,"a")
            ;
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      ((basic_string_view<char,_std::char_traits<char>_> *)&gtest_exception_1,
                       anon_var_dwarf_37cdd0 + 5);
            TextFormatDecodeData::AddString
                      ((TextFormatDecodeData *)local_28,1,local_108,_gtest_exception_1);
          }
          (*local_d0->_vptr_DeathTest[5])(local_d0,2);
          local_b4 = 5;
          testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&local_f8);
        }
LAB_00f8457d:
        local_b4 = 0;
      }
      std::
      unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>::
      ~unique_ptr((unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
                   *)&gtest_sentinel_1);
      if (local_b4 != 0) goto LAB_00f845bb;
    }
  }
  else {
LAB_00f845bb:
    testing::Message::Message(local_148);
    pcVar4 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/objectivec/text_format_decode_data_unittest.cc"
               ,0xca,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt_2,local_148);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt_2);
    testing::Message::~Message(local_148);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr_2,
               (internal *)"error: got empty string for making TextFormat data, input:",regex_01);
    bVar1 = testing::internal::DeathTest::Create
                      ("decode_data.AddString(1, \"\", \"a\")",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&gtest_dt_ptr_2,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/objectivec/text_format_decode_data_unittest.cc"
                       ,0xcc,&local_158);
    testing::
    Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~Matcher((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr_2);
    if (((bVar1 ^ 0xffU) & 1) != 0) goto LAB_00f84a2f;
    if (local_158 != (pointer)0x0) {
      std::
      unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>::
      unique_ptr<std::default_delete<testing::internal::DeathTest>,void>
                ((unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>
                  *)&gtest_sentinel_2,local_158);
      iVar2 = (*local_158->_vptr_DeathTest[2])();
      if (iVar2 == 0) {
        iVar2 = (*local_158->_vptr_DeathTest[3])();
        bVar1 = testing::internal::ExitedUnsuccessfully(iVar2);
        uVar3 = (*local_158->_vptr_DeathTest[4])(local_158,(ulong)bVar1);
        if ((uVar3 & 1) != 0) goto LAB_00f849f1;
        local_b4 = 6;
      }
      else {
        if (iVar2 == 1) {
          testing::internal::DeathTest::ReturnSentinel::ReturnSentinel(&local_180,local_158);
          bVar1 = testing::internal::AlwaysTrue();
          if (bVar1) {
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (&local_190,anon_var_dwarf_37cdd0 + 5);
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      ((basic_string_view<char,_std::char_traits<char>_> *)&gtest_exception_2,"a");
            TextFormatDecodeData::AddString
                      ((TextFormatDecodeData *)local_28,1,local_190,_gtest_exception_2);
          }
          (*local_158->_vptr_DeathTest[5])(local_158,2);
          local_b4 = 7;
          testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&local_180);
        }
LAB_00f849f1:
        local_b4 = 0;
      }
      std::
      unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>::
      ~unique_ptr((unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
                   *)&gtest_sentinel_2);
      if (local_b4 != 0) goto LAB_00f84a2f;
    }
  }
  else {
LAB_00f84a2f:
    testing::Message::Message(local_1d0);
    pcVar4 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)((long)&str_with_null_char.field_2 + 8),kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/objectivec/text_format_decode_data_unittest.cc"
               ,0xcc,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)((long)&str_with_null_char.field_2 + 8),local_1d0);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)((long)&str_with_null_char.field_2 + 8));
    testing::Message::~Message(local_1d0);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f8,"ab",4,(allocator *)((long)&gtest_dt_3 + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_dt_3 + 7));
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr_3,
               (internal *)"error: got a null char in a string for making TextFormat data, input:",
               regex_02);
    bVar1 = testing::internal::DeathTest::Create
                      ("decode_data.AddString(1, str_with_null_char, \"def\")",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&gtest_dt_ptr_3,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/objectivec/text_format_decode_data_unittest.cc"
                       ,0xd3,&local_208);
    testing::
    Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~Matcher((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr_3);
    if (((bVar1 ^ 0xffU) & 1) != 0) goto LAB_00f84f18;
    if (local_208 != (pointer)0x0) {
      std::
      unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>::
      unique_ptr<std::default_delete<testing::internal::DeathTest>,void>
                ((unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>
                  *)&gtest_sentinel_3,local_208);
      iVar2 = (*local_208->_vptr_DeathTest[2])();
      if (iVar2 == 0) {
        iVar2 = (*local_208->_vptr_DeathTest[3])();
        bVar1 = testing::internal::ExitedUnsuccessfully(iVar2);
        uVar3 = (*local_208->_vptr_DeathTest[4])(local_208,(ulong)bVar1);
        if ((uVar3 & 1) != 0) goto LAB_00f84eda;
        local_b4 = 8;
      }
      else {
        if (iVar2 == 1) {
          testing::internal::DeathTest::ReturnSentinel::ReturnSentinel(&local_230,local_208);
          bVar1 = testing::internal::AlwaysTrue();
          if (bVar1) {
            local_240 = (string_view)
                        std::__cxx11::string::operator_cast_to_basic_string_view(local_1f8);
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      ((basic_string_view<char,_std::char_traits<char>_> *)&gtest_exception_3,"def")
            ;
            TextFormatDecodeData::AddString
                      ((TextFormatDecodeData *)local_28,1,local_240,_gtest_exception_3);
          }
          (*local_208->_vptr_DeathTest[5])(local_208,2);
          local_b4 = 9;
          testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&local_230);
        }
LAB_00f84eda:
        local_b4 = 0;
      }
      std::
      unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>::
      ~unique_ptr((unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
                   *)&gtest_sentinel_3);
      if (local_b4 != 0) goto LAB_00f84f18;
    }
  }
  else {
LAB_00f84f18:
    testing::Message::Message(local_280);
    pcVar4 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt_4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/objectivec/text_format_decode_data_unittest.cc"
               ,0xd3,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt_4,local_280);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt_4);
    testing::Message::~Message(local_280);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr_4,
               (internal *)"error: got a null char in a string for making TextFormat data, input:",
               regex_03);
    bVar1 = testing::internal::DeathTest::Create
                      ("decode_data.AddString(1, \"def\", str_with_null_char)",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&gtest_dt_ptr_4,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/objectivec/text_format_decode_data_unittest.cc"
                       ,0xd6,&local_290);
    testing::
    Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~Matcher((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr_4);
    if (((bVar1 ^ 0xffU) & 1) != 0) goto LAB_00f85393;
    if (local_290 != (pointer)0x0) {
      std::
      unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>::
      unique_ptr<std::default_delete<testing::internal::DeathTest>,void>
                ((unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>
                  *)&gtest_sentinel_4,local_290);
      iVar2 = (*local_290->_vptr_DeathTest[2])();
      if (iVar2 == 0) {
        iVar2 = (*local_290->_vptr_DeathTest[3])();
        bVar1 = testing::internal::ExitedUnsuccessfully(iVar2);
        uVar3 = (*local_290->_vptr_DeathTest[4])(local_290,(ulong)bVar1);
        if ((uVar3 & 1) != 0) goto LAB_00f85355;
        local_b4 = 10;
      }
      else {
        if (iVar2 == 1) {
          testing::internal::DeathTest::ReturnSentinel::ReturnSentinel(&local_2b8,local_290);
          bVar1 = testing::internal::AlwaysTrue();
          if (bVar1) {
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (&local_2c8,"def");
            desired_output =
                 (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(local_1f8);
            local_2d0 = desired_output._M_str;
            gtest_exception_4 = (exception *)desired_output._M_len;
            TextFormatDecodeData::AddString
                      ((TextFormatDecodeData *)local_28,1,local_2c8,desired_output);
          }
          (*local_290->_vptr_DeathTest[5])(local_290,2);
          local_b4 = 0xb;
          testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&local_2b8);
        }
LAB_00f85355:
        local_b4 = 0;
      }
      std::
      unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>::
      ~unique_ptr((unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
                   *)&gtest_sentinel_4);
      if (local_b4 != 0) goto LAB_00f85393;
    }
  }
  else {
LAB_00f85393:
    testing::Message::Message(local_308);
    pcVar4 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              (&local_310,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/objectivec/text_format_decode_data_unittest.cc"
               ,0xd6,pcVar4);
    testing::internal::AssertHelper::operator=(&local_310,local_308);
    testing::internal::AssertHelper::~AssertHelper(&local_310);
    testing::Message::~Message(local_308);
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_320,"abcdefghIJ");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_330,"abcdefghIJ");
  TextFormatDecodeData::AddString((TextFormatDecodeData *)local_28,1,local_320,local_330);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_340,"abcdefghIJ");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_350,"_AbcdefghIJ")
  ;
  TextFormatDecodeData::AddString((TextFormatDecodeData *)local_28,3,local_340,local_350);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_360,"abcdefghIJ");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&gtest_dt_5,"Abcd_EfghIJ");
  TextFormatDecodeData::AddString((TextFormatDecodeData *)local_28,2,local_360,_gtest_dt_5);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr_5,
               (internal *)"error: duplicate key \\(2\\) making TextFormat data, input:",regex_04);
    bVar1 = testing::internal::DeathTest::Create
                      ("decode_data.AddString(2, \"xyz\", \"x_yz\")",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&gtest_dt_ptr_5,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/objectivec/text_format_decode_data_unittest.cc"
                       ,0xde,&local_378);
    testing::
    Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~Matcher((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr_5);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      if (local_378 == (pointer)0x0) goto LAB_00f859a9;
      std::
      unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>::
      unique_ptr<std::default_delete<testing::internal::DeathTest>,void>
                ((unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>
                  *)&gtest_sentinel_5,local_378);
      iVar2 = (*local_378->_vptr_DeathTest[2])();
      if (iVar2 == 0) {
        iVar2 = (*local_378->_vptr_DeathTest[3])();
        bVar1 = testing::internal::ExitedUnsuccessfully(iVar2);
        uVar3 = (*local_378->_vptr_DeathTest[4])(local_378,(ulong)bVar1);
        if ((uVar3 & 1) != 0) goto LAB_00f858c6;
        local_b4 = 0xc;
      }
      else {
        if (iVar2 == 1) {
          testing::internal::DeathTest::ReturnSentinel::ReturnSentinel(&local_3a0,local_378);
          bVar1 = testing::internal::AlwaysTrue();
          if (bVar1) {
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (&local_3b0,"xyz");
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      ((basic_string_view<char,_std::char_traits<char>_> *)&gtest_exception_5,"x_yz"
                      );
            TextFormatDecodeData::AddString
                      ((TextFormatDecodeData *)local_28,2,local_3b0,_gtest_exception_5);
          }
          (*local_378->_vptr_DeathTest[5])(local_378,2);
          local_b4 = 0xd;
          testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&local_3a0);
        }
LAB_00f858c6:
        local_b4 = 0;
      }
      std::
      unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>::
      ~unique_ptr((unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
                   *)&gtest_sentinel_5);
      if (local_b4 == 0) goto LAB_00f859a9;
    }
  }
  testing::Message::Message(local_3f0);
  pcVar4 = testing::internal::DeathTest::LastMessage();
  testing::internal::AssertHelper::AssertHelper
            (&local_3f8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/objectivec/text_format_decode_data_unittest.cc"
             ,0xde,pcVar4);
  testing::internal::AssertHelper::operator=(&local_3f8,local_3f0);
  testing::internal::AssertHelper::~AssertHelper(&local_3f8);
  testing::Message::~Message(local_3f0);
LAB_00f859a9:
  std::__cxx11::string::~string(local_1f8);
  TextFormatDecodeData::~TextFormatDecodeData((TextFormatDecodeData *)local_28);
  return;
}

Assistant:

TEST(ObjCHelperDeathTest, TextFormatDecodeData_Failures) {
  TextFormatDecodeData decode_data;

  // Empty inputs.

  EXPECT_DEATH(decode_data.AddString(1, "", ""),
               "error: got empty string for making TextFormat data, input:");
  EXPECT_DEATH(decode_data.AddString(1, "a", ""),
               "error: got empty string for making TextFormat data, input:");
  EXPECT_DEATH(decode_data.AddString(1, "", "a"),
               "error: got empty string for making TextFormat data, input:");

  // Null char in the string.

  std::string str_with_null_char("ab\0c", 4);
  EXPECT_DEATH(
      decode_data.AddString(1, str_with_null_char, "def"),
      "error: got a null char in a string for making TextFormat data, input:");
  EXPECT_DEATH(
      decode_data.AddString(1, "def", str_with_null_char),
      "error: got a null char in a string for making TextFormat data, input:");

  // Duplicate keys

  decode_data.AddString(1, "abcdefghIJ", "abcdefghIJ");
  decode_data.AddString(3, "abcdefghIJ", "_AbcdefghIJ");
  decode_data.AddString(2, "abcdefghIJ", "Abcd_EfghIJ");
  EXPECT_DEATH(decode_data.AddString(2, "xyz", "x_yz"),
               "error: duplicate key \\(2\\) making TextFormat data, input:");
}